

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsEntitiesToSides(FmsIntType idx_type,FmsInt ent_sides,FmsInt loc_side_begin,
                      FmsInt num_loc_sides,void *ents,FmsInt side_sides,void *sides,
                      FmsInt res_stride,FmsInt res_off,FmsInt *res,FmsInt num_ents)

{
  long lVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  int iVar5;
  ulong in_RAX;
  FmsInt *pFVar6;
  FmsInt ss_id;
  FmsInt FVar7;
  FmsInt FVar8;
  FmsInt loc_off;
  FmsInt FVar9;
  FmsInt *pFVar10;
  
  iVar5 = (int)in_RAX;
  if (idx_type < FMS_NUM_INT_TYPES) {
    pFVar6 = res + res_off;
    switch(idx_type) {
    case FMS_INT8:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          cVar3 = *(char *)((long)ents + FVar9 + FVar8 * ent_sides + loc_side_begin);
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = (ulong)*(char *)((long)sides + FVar7 + (long)cVar3 * side_sides);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_INT16:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        in_RAX = FVar8 * ent_sides;
        lVar1 = in_RAX * 2;
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          in_RAX = (long)*(short *)((long)ents + FVar9 * 2 + lVar1 + loc_side_begin * 2) *
                   side_sides;
          lVar2 = in_RAX * 2;
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = (ulong)*(short *)((long)sides + FVar7 * 2 + lVar2);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_INT32:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        in_RAX = FVar8 * ent_sides;
        lVar1 = in_RAX * 4;
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          in_RAX = (long)*(int *)((long)ents + FVar9 * 4 + lVar1 + loc_side_begin * 4) * side_sides;
          lVar2 = in_RAX * 4;
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = (ulong)*(int *)((long)sides + FVar7 * 4 + lVar2);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_INT64:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        in_RAX = FVar8 * ent_sides;
        lVar1 = in_RAX * 8;
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          in_RAX = *(long *)((long)ents + FVar9 * 8 + lVar1 + loc_side_begin * 8) * side_sides;
          lVar2 = in_RAX * 8;
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = *(ulong *)((long)sides + FVar7 * 8 + lVar2);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_ORIENTATION_INT_TYPE:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          bVar4 = *(byte *)((long)ents + FVar9 + FVar8 * ent_sides + loc_side_begin);
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = (ulong)*(byte *)((long)sides + FVar7 + bVar4 * side_sides);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_UINT16:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        in_RAX = FVar8 * ent_sides;
        lVar1 = in_RAX * 2;
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          in_RAX = *(ushort *)((long)ents + FVar9 * 2 + lVar1 + loc_side_begin * 2) * side_sides;
          lVar2 = in_RAX * 2;
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = (ulong)*(ushort *)((long)sides + FVar7 * 2 + lVar2);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_UINT32:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        in_RAX = FVar8 * ent_sides;
        lVar1 = in_RAX * 4;
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          in_RAX = *(uint *)((long)ents + FVar9 * 4 + lVar1 + loc_side_begin * 4) * side_sides;
          lVar2 = in_RAX * 4;
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = (ulong)*(uint *)((long)sides + FVar7 * 4 + lVar2);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
      break;
    case FMS_INT_TYPE:
      for (FVar8 = 0; iVar5 = (int)in_RAX, FVar8 != num_ents; FVar8 = FVar8 + 1) {
        in_RAX = FVar8 * ent_sides;
        lVar1 = in_RAX * 8;
        pFVar10 = pFVar6;
        for (FVar9 = 0; FVar9 != num_loc_sides; FVar9 = FVar9 + 1) {
          in_RAX = *(long *)((long)ents + FVar9 * 8 + lVar1 + loc_side_begin * 8) * side_sides;
          lVar2 = in_RAX * 8;
          for (FVar7 = 0; side_sides != FVar7; FVar7 = FVar7 + 1) {
            in_RAX = *(ulong *)((long)sides + FVar7 * 8 + lVar2);
            pFVar10[FVar7] = in_RAX;
          }
          pFVar10 = pFVar10 + side_sides;
        }
        pFVar6 = pFVar6 + res_stride;
      }
    }
  }
  return iVar5;
}

Assistant:

static int FmsEntitiesToSides(FmsIntType idx_type, FmsInt ent_sides,
                              FmsInt loc_side_begin, FmsInt num_loc_sides,
                              const void *ents, FmsInt side_sides,
                              const void *sides, FmsInt res_stride,
                              FmsInt res_off, FmsInt *res, FmsInt num_ents) {
  if (idx_type >= FMS_NUM_INT_TYPES) { E_RETURN(1); }
  FmsInt *res_ = res + res_off;
  switch (idx_type) {
  case FMS_INT8:   FMS_E2S_TEMPL(int8_t);
  case FMS_INT16:  FMS_E2S_TEMPL(int16_t);
  case FMS_INT32:  FMS_E2S_TEMPL(int32_t);
  case FMS_INT64:  FMS_E2S_TEMPL(int64_t);
  case FMS_UINT8:  FMS_E2S_TEMPL(uint8_t);
  case FMS_UINT16: FMS_E2S_TEMPL(uint16_t);
  case FMS_UINT32: FMS_E2S_TEMPL(uint32_t);
  case FMS_UINT64: FMS_E2S_TEMPL(uint64_t);
  default: FmsAbortNotImplemented();
  }
  return 0;
}